

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

int64 __thiscall IR::Opnd::GetImmediateValue(Opnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  intptr_t iVar3;
  undefined4 *puVar4;
  _func_int **pp_Var5;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
  case OpndKindInt64Const:
    pp_Var5 = this[1]._vptr_Opnd;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x1d3,"((0))","Unexpected immediate opnd kind");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pp_Var5 = (_func_int **)0x0;
    break;
  case OpndKindHelperCall:
    iVar3 = GetMethodAddress(func->m_threadContextInfo,(HelperCallOpnd *)this);
    return iVar3;
  case OpndKindAddr:
    pp_Var5 = this[2]._vptr_Opnd;
  }
  return (int64)pp_Var5;
}

Assistant:

int64
Opnd::GetImmediateValue(Func* func)
{
    switch (this->GetKind())
    {
    case OpndKindIntConst:
        return this->AsIntConstOpnd()->GetValue();

    case OpndKindInt64Const:
        return this->AsInt64ConstOpnd()->GetValue();

    case OpndKindAddr:
        return (intptr_t)this->AsAddrOpnd()->m_address;

    case OpndKindHelperCall:
        return (intptr_t)IR::GetMethodAddress(func->GetThreadContextInfo(), this->AsHelperCallOpnd());

    default:
        AssertMsg(UNREACHED, "Unexpected immediate opnd kind");
        return 0;
    }
}